

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  undefined1 (*pauVar16) [16];
  int iVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  InstancePrimitive *prim;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  undefined4 uVar27;
  ulong unaff_R14;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1031;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  ulong local_1008;
  ulong local_1000;
  undefined1 (*local_ff8) [16];
  ulong local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_ff8 = (undefined1 (*) [16])local_f68;
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_f88 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar39 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_f98 = 0.0;
      if (0.0 <= fVar39) {
        local_f98 = fVar39;
      }
      fVar39 = (ray->super_RayK<1>).tfar;
      fVar38 = 0.0;
      if (0.0 <= fVar39) {
        fVar38 = fVar39;
      }
      auVar28._4_4_ = -(uint)(ABS(aVar5.y) < DAT_01ff1d40._4_4_);
      auVar28._0_4_ = -(uint)(ABS(aVar5.x) < (float)DAT_01ff1d40);
      auVar28._8_4_ = -(uint)(ABS(aVar5.z) < DAT_01ff1d40._8_4_);
      auVar28._12_4_ = -(uint)(ABS(aVar5.field_3.w) < DAT_01ff1d40._12_4_);
      auVar43 = blendvps((undefined1  [16])aVar5,_DAT_01ff1d40,auVar28);
      auVar28 = rcpps(auVar28,auVar43);
      local_fd8 = auVar28._0_4_;
      local_fe8 = auVar28._4_4_;
      local_fa8 = auVar28._8_4_;
      local_fd8 = (1.0 - auVar43._0_4_ * local_fd8) * local_fd8 + local_fd8;
      local_fe8 = (1.0 - auVar43._4_4_ * local_fe8) * local_fe8 + local_fe8;
      local_fa8 = (1.0 - auVar43._8_4_ * local_fa8) * local_fa8 + local_fa8;
      local_1000 = (ulong)(local_fd8 < 0.0) << 4;
      local_1008 = (ulong)(local_fe8 < 0.0) << 4 | 0x20;
      local_1020 = (ulong)(local_fa8 < 0.0) << 4 | 0x40;
      local_1028 = local_1000 ^ 0x10;
      local_1030 = local_1008 ^ 0x10;
      local_ff0 = local_1020 ^ 0x10;
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      uVar20 = local_1008;
      uVar21 = local_1020;
      uVar23 = local_1028;
      uVar24 = local_1030;
      uVar25 = local_1000;
      fVar39 = fVar38;
      fVar40 = fVar38;
      fVar41 = fVar38;
      fVar56 = local_f88;
      fVar57 = local_f88;
      fVar58 = local_f88;
      fVar59 = local_f88;
      fVar60 = local_f98;
      fVar61 = local_f98;
      fVar62 = local_f98;
      fVar63 = local_f98;
      fVar64 = local_fa8;
      fVar65 = local_fa8;
      fVar66 = local_fa8;
      fVar67 = local_fa8;
      fVar68 = local_fb8;
      fVar69 = local_fb8;
      fVar70 = local_fb8;
      fVar71 = local_fb8;
      fVar72 = local_fc8;
      fVar73 = local_fc8;
      fVar74 = local_fc8;
      fVar75 = local_fc8;
      fVar76 = local_fd8;
      fVar77 = local_fd8;
      fVar78 = local_fd8;
      fVar79 = local_fd8;
      fVar80 = local_fe8;
      fVar81 = local_fe8;
      fVar82 = local_fe8;
      fVar83 = local_fe8;
      do {
        do {
          if (local_ff8 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar16 = local_ff8 + -1;
          local_ff8 = local_ff8 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar16 + 8));
        uVar19 = *(ulong *)*local_ff8;
        do {
          if ((uVar19 & 8) == 0) {
            fVar15 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar18 = uVar19 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar18 + 0x80 + uVar25);
            pfVar1 = (float *)(uVar18 + 0x20 + uVar25);
            auVar50._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar68) * fVar76;
            auVar50._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar69) * fVar77;
            auVar50._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar70) * fVar78;
            auVar50._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar71) * fVar79;
            auVar43._4_4_ = fVar61;
            auVar43._0_4_ = fVar60;
            auVar43._8_4_ = fVar62;
            auVar43._12_4_ = fVar63;
            pfVar2 = (float *)(uVar18 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar18 + 0x20 + uVar20);
            auVar28 = maxps(auVar43,auVar50);
            auVar46._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar72) * fVar80;
            auVar46._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar73) * fVar81;
            auVar46._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar74) * fVar82;
            auVar46._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar75) * fVar83;
            pfVar2 = (float *)(uVar18 + 0x80 + uVar21);
            pfVar1 = (float *)(uVar18 + 0x20 + uVar21);
            auVar53._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar56) * fVar64;
            auVar53._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar57) * fVar65;
            auVar53._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar58) * fVar66;
            auVar53._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar59) * fVar67;
            auVar43 = maxps(auVar46,auVar53);
            local_1018 = maxps(auVar28,auVar43);
            pfVar3 = (float *)(uVar18 + 0x80 + uVar23);
            pfVar1 = (float *)(uVar18 + 0x20 + uVar23);
            pfVar4 = (float *)(uVar18 + 0x80 + uVar24);
            pfVar2 = (float *)(uVar18 + 0x20 + uVar24);
            auVar47._0_4_ = ((*pfVar3 * fVar15 + *pfVar1) - fVar68) * fVar76;
            auVar47._4_4_ = ((pfVar3[1] * fVar15 + pfVar1[1]) - fVar69) * fVar77;
            auVar47._8_4_ = ((pfVar3[2] * fVar15 + pfVar1[2]) - fVar70) * fVar78;
            auVar47._12_4_ = ((pfVar3[3] * fVar15 + pfVar1[3]) - fVar71) * fVar79;
            auVar51._0_4_ = ((*pfVar4 * fVar15 + *pfVar2) - fVar72) * fVar80;
            auVar51._4_4_ = ((pfVar4[1] * fVar15 + pfVar2[1]) - fVar73) * fVar81;
            auVar51._8_4_ = ((pfVar4[2] * fVar15 + pfVar2[2]) - fVar74) * fVar82;
            auVar51._12_4_ = ((pfVar4[3] * fVar15 + pfVar2[3]) - fVar75) * fVar83;
            pfVar2 = (float *)(uVar18 + 0x80 + local_ff0);
            pfVar1 = (float *)(uVar18 + 0x20 + local_ff0);
            auVar55._0_4_ = ((*pfVar2 * fVar15 + *pfVar1) - fVar56) * fVar64;
            auVar55._4_4_ = ((pfVar2[1] * fVar15 + pfVar1[1]) - fVar57) * fVar65;
            auVar55._8_4_ = ((pfVar2[2] * fVar15 + pfVar1[2]) - fVar58) * fVar66;
            auVar55._12_4_ = ((pfVar2[3] * fVar15 + pfVar1[3]) - fVar59) * fVar67;
            auVar43 = minps(auVar51,auVar55);
            auVar44._4_4_ = fVar39;
            auVar44._0_4_ = fVar38;
            auVar44._8_4_ = fVar40;
            auVar44._12_4_ = fVar41;
            auVar28 = minps(auVar44,auVar47);
            auVar28 = minps(auVar28,auVar43);
            if (((uint)uVar19 & 7) == 6) {
              bVar11 = (fVar15 < *(float *)(uVar18 + 0xf0) && *(float *)(uVar18 + 0xe0) <= fVar15)
                       && local_1018._0_4_ <= auVar28._0_4_;
              bVar12 = (fVar15 < *(float *)(uVar18 + 0xf4) && *(float *)(uVar18 + 0xe4) <= fVar15)
                       && local_1018._4_4_ <= auVar28._4_4_;
              bVar13 = (fVar15 < *(float *)(uVar18 + 0xf8) && *(float *)(uVar18 + 0xe8) <= fVar15)
                       && local_1018._8_4_ <= auVar28._8_4_;
              bVar14 = (fVar15 < *(float *)(uVar18 + 0xfc) && *(float *)(uVar18 + 0xec) <= fVar15)
                       && local_1018._12_4_ <= auVar28._12_4_;
            }
            else {
              bVar11 = local_1018._0_4_ <= auVar28._0_4_;
              bVar12 = local_1018._4_4_ <= auVar28._4_4_;
              bVar13 = local_1018._8_4_ <= auVar28._8_4_;
              bVar14 = local_1018._12_4_ <= auVar28._12_4_;
            }
            auVar29._0_4_ = (uint)bVar11 * -0x80000000;
            auVar29._4_4_ = (uint)bVar12 * -0x80000000;
            auVar29._8_4_ = (uint)bVar13 * -0x80000000;
            auVar29._12_4_ = (uint)bVar14 * -0x80000000;
            uVar27 = movmskps((int)unaff_R14,auVar29);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar27);
          }
          if ((uVar19 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar17 = 4;
            }
            else {
              uVar18 = uVar19 & 0xfffffffffffffff0;
              lVar26 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              iVar17 = 0;
              uVar19 = *(ulong *)(uVar18 + lVar26 * 8);
              uVar22 = unaff_R14 - 1 & unaff_R14;
              if (uVar22 != 0) {
                uVar6 = *(uint *)(local_1018 + lVar26 * 4);
                lVar26 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                  }
                }
                uVar9 = *(ulong *)(uVar18 + lVar26 * 8);
                uVar7 = *(uint *)(local_1018 + lVar26 * 4);
                uVar22 = uVar22 - 1 & uVar22;
                uVar21 = local_1020;
                uVar23 = local_1028;
                uVar24 = local_1030;
                if (uVar22 == 0) {
                  if (uVar6 < uVar7) {
                    *(ulong *)*local_ff8 = uVar9;
                    *(uint *)((long)*local_ff8 + 8) = uVar7;
                    local_ff8 = local_ff8 + 1;
                  }
                  else {
                    *(ulong *)*local_ff8 = uVar19;
                    *(uint *)((long)*local_ff8 + 8) = uVar6;
                    uVar19 = uVar9;
                    local_ff8 = local_ff8 + 1;
                  }
                }
                else {
                  auVar42._8_4_ = uVar6;
                  auVar42._0_8_ = uVar19;
                  auVar42._12_4_ = 0;
                  auVar48._8_4_ = uVar7;
                  auVar48._0_8_ = uVar9;
                  auVar48._12_4_ = 0;
                  lVar26 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                    }
                  }
                  uVar10 = *(undefined8 *)(uVar18 + lVar26 * 8);
                  iVar8 = *(int *)(local_1018 + lVar26 * 4);
                  auVar45._8_4_ = iVar8;
                  auVar45._0_8_ = uVar10;
                  auVar45._12_4_ = 0;
                  auVar30._8_4_ = -(uint)((int)uVar6 < (int)uVar7);
                  uVar22 = uVar22 - 1 & uVar22;
                  if (uVar22 == 0) {
                    auVar30._4_4_ = auVar30._8_4_;
                    auVar30._0_4_ = auVar30._8_4_;
                    auVar30._12_4_ = auVar30._8_4_;
                    auVar52._8_4_ = uVar7;
                    auVar52._0_8_ = uVar9;
                    auVar52._12_4_ = 0;
                    auVar43 = blendvps(auVar52,auVar42,auVar30);
                    auVar28 = blendvps(auVar42,auVar48,auVar30);
                    auVar31._8_4_ = -(uint)(auVar43._8_4_ < iVar8);
                    auVar31._4_4_ = auVar31._8_4_;
                    auVar31._0_4_ = auVar31._8_4_;
                    auVar31._12_4_ = auVar31._8_4_;
                    auVar49._8_4_ = iVar8;
                    auVar49._0_8_ = uVar10;
                    auVar49._12_4_ = 0;
                    auVar50 = blendvps(auVar49,auVar43,auVar31);
                    auVar53 = blendvps(auVar43,auVar45,auVar31);
                    auVar32._8_4_ = -(uint)(auVar28._8_4_ < auVar53._8_4_);
                    auVar32._4_4_ = auVar32._8_4_;
                    auVar32._0_4_ = auVar32._8_4_;
                    auVar32._12_4_ = auVar32._8_4_;
                    auVar43 = blendvps(auVar53,auVar28,auVar32);
                    auVar28 = blendvps(auVar28,auVar53,auVar32);
                    *local_ff8 = auVar28;
                    local_ff8[1] = auVar43;
                    uVar19 = auVar50._0_8_;
                    local_ff8 = local_ff8 + 2;
                  }
                  else {
                    lVar26 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                      }
                    }
                    auVar33._4_4_ = auVar30._8_4_;
                    auVar33._0_4_ = auVar30._8_4_;
                    auVar33._8_4_ = auVar30._8_4_;
                    auVar33._12_4_ = auVar30._8_4_;
                    auVar53 = blendvps(auVar48,auVar42,auVar33);
                    auVar28 = blendvps(auVar42,auVar48,auVar33);
                    auVar54._8_4_ = *(int *)(local_1018 + lVar26 * 4);
                    auVar54._0_8_ = *(undefined8 *)(uVar18 + lVar26 * 8);
                    auVar54._12_4_ = 0;
                    auVar34._8_4_ = -(uint)(iVar8 < *(int *)(local_1018 + lVar26 * 4));
                    auVar34._4_4_ = auVar34._8_4_;
                    auVar34._0_4_ = auVar34._8_4_;
                    auVar34._12_4_ = auVar34._8_4_;
                    auVar50 = blendvps(auVar54,auVar45,auVar34);
                    auVar43 = blendvps(auVar45,auVar54,auVar34);
                    auVar35._8_4_ = -(uint)(auVar28._8_4_ < auVar43._8_4_);
                    auVar35._4_4_ = auVar35._8_4_;
                    auVar35._0_4_ = auVar35._8_4_;
                    auVar35._12_4_ = auVar35._8_4_;
                    auVar55 = blendvps(auVar43,auVar28,auVar35);
                    auVar28 = blendvps(auVar28,auVar43,auVar35);
                    auVar36._8_4_ = -(uint)(auVar53._8_4_ < auVar50._8_4_);
                    auVar36._4_4_ = auVar36._8_4_;
                    auVar36._0_4_ = auVar36._8_4_;
                    auVar36._12_4_ = auVar36._8_4_;
                    auVar43 = blendvps(auVar50,auVar53,auVar36);
                    auVar53 = blendvps(auVar53,auVar50,auVar36);
                    auVar37._8_4_ = -(uint)(auVar53._8_4_ < auVar55._8_4_);
                    auVar37._4_4_ = auVar37._8_4_;
                    auVar37._0_4_ = auVar37._8_4_;
                    auVar37._12_4_ = auVar37._8_4_;
                    auVar50 = blendvps(auVar55,auVar53,auVar37);
                    auVar53 = blendvps(auVar53,auVar55,auVar37);
                    *local_ff8 = auVar28;
                    local_ff8[1] = auVar53;
                    local_ff8[2] = auVar50;
                    uVar19 = auVar43._0_8_;
                    local_ff8 = local_ff8 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          lVar26 = (ulong)((uint)uVar19 & 0xf) - 8;
          if (lVar26 != 0) {
            prim = (InstancePrimitive *)(uVar19 & 0xfffffffffffffff0);
            do {
              InstanceIntersector1MB::intersect(&local_1031,ray,context,prim);
              prim = prim + 1;
              lVar26 = lVar26 + -1;
            } while (lVar26 != 0);
          }
          fVar38 = (ray->super_RayK<1>).tfar;
          uVar20 = local_1008;
          uVar21 = local_1020;
          uVar23 = local_1028;
          uVar24 = local_1030;
          uVar25 = local_1000;
          fVar39 = fVar38;
          fVar40 = fVar38;
          fVar41 = fVar38;
          fVar56 = local_f88;
          fVar57 = fStack_f84;
          fVar58 = fStack_f80;
          fVar59 = fStack_f7c;
          fVar60 = local_f98;
          fVar61 = fStack_f94;
          fVar62 = fStack_f90;
          fVar63 = fStack_f8c;
          fVar64 = local_fa8;
          fVar65 = fStack_fa4;
          fVar66 = fStack_fa0;
          fVar67 = fStack_f9c;
          fVar68 = local_fb8;
          fVar69 = fStack_fb4;
          fVar70 = fStack_fb0;
          fVar71 = fStack_fac;
          fVar72 = local_fc8;
          fVar73 = fStack_fc4;
          fVar74 = fStack_fc0;
          fVar75 = fStack_fbc;
          fVar76 = local_fd8;
          fVar77 = fStack_fd4;
          fVar78 = fStack_fd0;
          fVar79 = fStack_fcc;
          fVar80 = local_fe8;
          fVar81 = fStack_fe4;
          fVar82 = fStack_fe0;
          fVar83 = fStack_fdc;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }